

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ComparisonExpression::Copy(ComparisonExpression *this)

{
  pointer pPVar1;
  pointer this_00;
  pointer *__ptr;
  ParsedExpression *in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_20;
  __uniq_ptr_impl<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>_>
  local_18;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 1));
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_20,pPVar1);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)&in_RSI[1].super_BaseExpression.type);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_28,pPVar1);
  make_uniq<duckdb::ComparisonExpression,duckdb::ExpressionType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((duckdb *)&local_18,&(in_RSI->super_BaseExpression).type,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_20,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_28);
  if (local_28._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_20._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  this_00 = unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
            ::operator->((unique_ptr<duckdb::ComparisonExpression,_std::default_delete<duckdb::ComparisonExpression>,_true>
                          *)&local_18);
  ParsedExpression::CopyProperties(&this_00->super_ParsedExpression,in_RSI);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::ComparisonExpression_*,_std::default_delete<duckdb::ComparisonExpression>_>
       .super__Head_base<0UL,_duckdb::ComparisonExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ComparisonExpression::Copy() const {
	auto copy = make_uniq<ComparisonExpression>(type, left->Copy(), right->Copy());
	copy->CopyProperties(*this);
	return std::move(copy);
}